

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

uint __thiscall
fmt::anon_unknown_1::WidthHandler::visit_any_int<bool>(WidthHandler *this,bool value)

{
  bool bVar1;
  FormatError *this_00;
  byte in_SIL;
  CStringRef in_RDI;
  UnsignedType width;
  BasicCStringRef<char> local_18;
  uint local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_10 = (uint)local_9;
  bVar1 = internal::is_negative<bool>(false);
  if (bVar1) {
    *(undefined4 *)(*(long *)in_RDI.data_ + 8) = 1;
    local_10 = -local_10;
  }
  if (local_10 < 0x80000000) {
    return local_10;
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_18,"number is too big");
  FormatError::FormatError(this_00,in_RDI);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

unsigned visit_any_int(T value) {
    typedef typename internal::IntTraits<T>::MainType UnsignedType;
    UnsignedType width = static_cast<UnsignedType>(value);
    if (internal::is_negative(value)) {
      spec_.align_ = ALIGN_LEFT;
      width = 0 - width;
    }
    if (width > INT_MAX)
      FMT_THROW(FormatError("number is too big"));
    return static_cast<unsigned>(width);
  }